

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvacounter.c
# Opt level: O0

void nv40_start_monitoring(int cnum,int set,int s1,int s2,int s3,int s4)

{
  uint32_t in_ECX;
  uint32_t in_EDX;
  int in_ESI;
  int in_EDI;
  uint32_t in_R8D;
  uint32_t in_R9D;
  
  nva_wr32(in_EDI,in_ESI * 4 + 0xa7c0,1);
  nva_wr32(in_EDI,in_ESI * 4 + 0xa500,0);
  nva_wr32(in_EDI,in_ESI * 4 + 0xa520,0);
  nva_wr32(in_EDI,in_ESI * 4 + 0xa400,in_EDX);
  nva_wr32(in_EDI,in_ESI * 4 + 0xa440,in_ECX);
  nva_wr32(in_EDI,in_ESI * 4 + 0xa480,in_R8D);
  nva_wr32(in_EDI,in_ESI * 4 + 0xa4c0,in_R9D);
  nva_wr32(in_EDI,in_ESI * 4 + 0xa420,0xaaaa);
  nva_wr32(in_EDI,in_ESI * 4 + 0xa460,0xaaaa);
  nva_wr32(in_EDI,in_ESI * 4 + 0xa4a0,0xaaaa);
  nva_wr32(in_EDI,in_ESI * 4 + 0xa4e0,0xaaaa);
  nva_mask(in_EDX,in_ECX,in_R8D,in_R9D);
  return;
}

Assistant:

void nv40_start_monitoring(int cnum, int set, int s1, int s2, int s3, int s4)
{
	nva_wr32(cnum, 0xa7c0 + set * 4, 0x1);
	nva_wr32(cnum, 0xa500 + set * 4, 0);
	nva_wr32(cnum, 0xa520 + set * 4, 0);

	nva_wr32(cnum, 0xa400 + set * 4, s1);
	nva_wr32(cnum, 0xa440 + set * 4, s2);
	nva_wr32(cnum, 0xa480 + set * 4, s3);
	nva_wr32(cnum, 0xa4c0 + set * 4, s4);

	nva_wr32(cnum, 0xa420 + set * 4, 0xaaaa);
	nva_wr32(cnum, 0xa460 + set * 4, 0xaaaa);
	nva_wr32(cnum, 0xa4a0 + set * 4, 0xaaaa);
	nva_wr32(cnum, 0xa4e0 + set * 4, 0xaaaa);

	/* reset the counters */
	nva_mask(cnum, 0x400084, 0x20, 0x20);
}